

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall
soinn::ESOINN::ESOINN(ESOINN *this,int dim,int ageMax,int iterationThreshold,double c1,double c2)

{
  no_property local_31;
  double local_30;
  double c2_local;
  double c1_local;
  int local_18;
  int iterationThreshold_local;
  int ageMax_local;
  int dim_local;
  ESOINN *this_local;
  
  this->dim = dim;
  local_30 = c2;
  c2_local = c1;
  c1_local._4_4_ = iterationThreshold;
  local_18 = ageMax;
  iterationThreshold_local = dim;
  _ageMax_local = this;
  boost::
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&this->graph,&local_31);
  this->ageMax = local_18;
  this->iterationThreshold = c1_local._4_4_;
  this->c1 = c2_local;
  this->c2 = local_30;
  return;
}

Assistant:

ESOINN::ESOINN(int dim, int ageMax, int iterationThreshold, double c1, double c2):
    dim(dim),
    ageMax(ageMax),
    iterationThreshold(iterationThreshold),
    c1(c1),
    c2(c2)
{
}